

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool operator!=(ON_SubDEdgeSharpness *lhs,ON_SubDEdgeSharpness *rhs)

{
  float fVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  
  fVar1 = lhs->m_edge_sharpness[0];
  fVar2 = lhs->m_edge_sharpness[1];
  fVar3 = rhs->m_edge_sharpness[0];
  if ((fVar1 != fVar3) || (NAN(fVar1) || NAN(fVar3))) {
    bVar4 = -!NAN(rhs->m_edge_sharpness[1]) & -!NAN(fVar2);
  }
  else if ((fVar2 != rhs->m_edge_sharpness[1]) || (NAN(fVar2) || NAN(rhs->m_edge_sharpness[1]))) {
    bVar4 = !NAN(fVar1) && !NAN(fVar3);
  }
  else {
    bVar4 = 0;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool operator!=(const ON_SubDEdgeSharpness& lhs, const ON_SubDEdgeSharpness& rhs)
{
  const float* l = (const float*)(&lhs);
  const float* r = (const float*)(&rhs);

  // The compare must be done this way so
  // any nan results in false being returned.
  // (Note: x==x and x!=x are both false when x = nan.)
  if (l[0] != r[0])
    return (l[1] == l[1] && r[1] == r[1]);
  if (l[1] != r[1])
    return (l[0] == l[0] && r[0] == r[0]);
  return false;
}